

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

bool __thiscall
absl::numbers_internal::safe_strtou64_base
          (numbers_internal *this,string_view text,Nonnull<uint64_t_*> value,int base)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool local_1d;
  uint local_1c;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = (char *)text._M_len;
  local_1c = (uint)value;
  *(ulong *)text._M_str = 0;
  local_18._M_len = (size_t)this;
  bVar1 = anon_unknown_0::safe_parse_sign_and_base(&local_18,(Nonnull<int_*>)&local_1c,&local_1d);
  if ((bVar1) && (local_1d == false)) {
    uVar2 = (ulong)(int)local_1c;
    if ((long)uVar2 < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                    ,0x3da,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = unsigned long]"
                   );
    }
    if ((1 < local_1c) &&
       (0xffffffffffffffff / uVar2 !=
        *(ulong *)((anonymous_namespace)::LookupTables<unsigned_long>::kVmaxOverBase + uVar2 * 8)))
    {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                    ,0x3df,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = unsigned long]"
                   );
    }
    local_18._M_len = local_18._M_len + (long)local_18._M_str;
    uVar4 = 0;
    while ((((bVar1 = local_18._M_len <= local_18._M_str, uVar5 = uVar4, !bVar1 &&
             (uVar6 = (ulong)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_18._M_str],
             uVar6 < uVar2)) &&
            (uVar5 = 0xffffffffffffffff,
            uVar4 <= *(ulong *)((anonymous_namespace)::LookupTables<unsigned_long>::kVmaxOverBase +
                               uVar2 * 8))) &&
           (uVar3 = uVar4 * uVar2, uVar4 = uVar3 + uVar6, !CARRY8(uVar3,uVar6)))) {
      local_18._M_str = (char *)((numbers_internal *)local_18._M_str + 1);
    }
    *(ulong *)text._M_str = uVar5;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool safe_strtou64_base(absl::string_view text, absl::Nonnull<uint64_t*> value,
                        int base) {
  return safe_uint_internal<uint64_t>(text, value, base);
}